

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_api.c
# Opt level: O1

MPP_RET avs2d_callback(void *decoder,void *info)

{
  RK_S32 index;
  long lVar1;
  ulong uVar2;
  RK_U32 RVar3;
  RK_U32 RVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  MppFrame ref_frm;
  MppFrame mframe;
  RK_U32 local_4c;
  void *local_48;
  ulong local_40;
  undefined8 *local_38;
  
  lVar1 = *info;
  mframe = (MppFrame)0x0;
  ref_frm = (MppFrame)0x0;
  uVar5 = 0xff;
  if ((char)*(undefined8 *)(lVar1 + 8) < '\0') {
    uVar5 = (uint)((ulong)*(undefined8 *)(lVar1 + 8) >> 0x20) & 0xffff;
  }
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_api","In.","avs2d_callback");
  }
  local_38 = (undefined8 *)decoder;
  mpp_buf_slot_get_prop(*decoder,*(RK_S32 *)(lVar1 + 0x34),SLOT_FRAME_PTR,&mframe);
  if (mframe == (MppFrame)0x0) {
    if ((avs2d_parse_debug._1_1_ & 0x80) != 0) {
      _mpp_log_l(4,"avs2d_api","[CALLBACK]: failed to get frame\n",(char *)0x0);
    }
    goto LAB_00181b4a;
  }
  local_48 = info;
  if ((*(int *)((long)info + 0x10) == 0) && (uVar2 = *(ulong *)(lVar1 + 8), (uVar2 & 8) == 0)) {
    if ((uVar5 & (uint)(uVar2 >> 8) & 0xffffff) == 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = 1;
      if ((avs2d_parse_debug._1_1_ & 0x80) != 0) {
        uVar8 = 0;
        _mpp_log_l(4,"avs2d_api","[CALLBACK]: fake ref used, miss 0x%x used 0x%x\n",(char *)0x0,
                   uVar2 >> 8 & 0xffff,(ulong)uVar5);
        goto LAB_001819cd;
      }
    }
    uVar8 = 0;
  }
  else {
    uVar6 = (ulong)((*(ulong *)(lVar1 + 8) & 0x10) == 0);
    uVar8 = (ulong)(((uint)*(ulong *)(lVar1 + 8) & 0x10) >> 4);
  }
LAB_001819cd:
  lVar7 = 0;
  do {
    index = *(RK_S32 *)(lVar1 + 0x38 + lVar7 * 4);
    if (-1 < index) {
      mpp_buf_slot_get_prop((MppBufSlots)*local_38,index,SLOT_FRAME_PTR,&ref_frm);
      if (ref_frm != (MppFrame)0x0) {
        bVar9 = (uVar5 >> ((uint)lVar7 & 0x1f) & 1) != 0;
        if ((avs2d_parse_debug._1_1_ & 0x80) != 0) {
          local_4c = mpp_frame_get_poc(ref_frm);
          RVar3 = mpp_frame_get_errinfo(ref_frm);
          local_40 = uVar6;
          RVar4 = mpp_frame_get_discard(ref_frm);
          uVar6 = local_40;
          _mpp_log_l(4,"avs2d_api","[CALLBACK]: ref_frm poc %d, err %d, dis %d, ref_used %d\n",
                     (char *)0x0,(ulong)local_4c,(ulong)RVar3,(ulong)RVar4,(ulong)bVar9);
        }
        if (bVar9) {
          RVar3 = mpp_frame_get_discard(ref_frm);
          uVar6 = (ulong)((uint)uVar6 | RVar3);
          RVar3 = mpp_frame_get_errinfo(ref_frm);
          uVar8 = (ulong)((uint)uVar8 | RVar3);
        }
      }
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 7);
  mpp_frame_set_errinfo(mframe,(RK_U32)uVar8);
  mpp_frame_set_discard(mframe,(RK_U32)uVar6);
  if ((avs2d_parse_debug._1_1_ & 0x80) != 0) {
    RVar3 = mpp_frame_get_poc(mframe);
    _mpp_log_l(4,"avs2d_api",
               "[CALLBACK]: frame poc %d, ref=%d, dpberr=%d, harderr=%d, err:dis=%d:%d\n",
               (char *)0x0,(ulong)RVar3,(ulong)(*(uint *)(lVar1 + 8) >> 4 & 1),
               (ulong)(*(uint *)(lVar1 + 8) >> 3 & 1),(ulong)*(uint *)((long)local_48 + 0x10),uVar8,
               uVar6);
  }
LAB_00181b4a:
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_api","Out.","avs2d_callback");
  }
  return MPP_ERR_UNKNOW;
}

Assistant:

MPP_RET avs2d_callback(void *decoder, void *info)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    Avs2dCtx_t *p_dec = (Avs2dCtx_t *)decoder;
    DecCbHalDone *ctx = (DecCbHalDone *)info;
    HalDecTask *task_dec = (HalDecTask *)ctx->task;
    MppFrame mframe = NULL;
    MppFrame ref_frm = NULL;
    RK_U32 i = 0;
    RK_U32 error = 0;
    RK_U32 discard = 0;
    RK_U32 ref_used = task_dec->flags.ref_info_valid ? task_dec->flags.ref_used : 0xff;
    RK_U32 ref_used_flag = 0;

    AVS2D_PARSE_TRACE("In.");
    mpp_buf_slot_get_prop(p_dec->frame_slots, task_dec->output, SLOT_FRAME_PTR, &mframe);

    if (!mframe) {
        ret = MPP_ERR_UNKNOW;
        AVS2D_DBG(AVS2D_DBG_CALLBACK, "[CALLBACK]: failed to get frame\n");
        goto __FAILED;
    }

    if (ctx->hard_err || task_dec->flags.ref_err) {
        if (task_dec->flags.used_for_ref) {
            error = 1;
        } else {
            discard = 1;
        }
    } else {
        if (task_dec->flags.ref_miss & ref_used) {
            discard = 1;
            AVS2D_DBG(AVS2D_DBG_CALLBACK, "[CALLBACK]: fake ref used, miss 0x%x used 0x%x\n",
                      task_dec->flags.ref_miss, ref_used);
        }
    }

    for (i = 0; i < AVS2_MAX_REFS; i++) {
        if (task_dec->refer[i] < 0)
            continue;

        mpp_buf_slot_get_prop(p_dec->frame_slots, task_dec->refer[i], SLOT_FRAME_PTR, &ref_frm);
        if (!ref_frm)
            continue;

        ref_used_flag = (ref_used >> i) & 1;
        //TODO: In fast mode, ref list isn't kept sync with task flag.ref_used
        AVS2D_DBG(AVS2D_DBG_CALLBACK, "[CALLBACK]: ref_frm poc %d, err %d, dis %d, ref_used %d\n",
                  mpp_frame_get_poc(ref_frm), mpp_frame_get_errinfo(ref_frm),
                  mpp_frame_get_discard(ref_frm), ref_used_flag);

        if (ref_used_flag) {
            discard |= mpp_frame_get_discard(ref_frm);
            error |= mpp_frame_get_errinfo(ref_frm);
        }
    }

    mpp_frame_set_errinfo(mframe, error);
    mpp_frame_set_discard(mframe, discard);

    AVS2D_DBG(AVS2D_DBG_CALLBACK, "[CALLBACK]: frame poc %d, ref=%d, dpberr=%d, harderr=%d, err:dis=%d:%d\n",
              mpp_frame_get_poc(mframe), task_dec->flags.used_for_ref, task_dec->flags.ref_err,
              ctx->hard_err, error, discard);

__FAILED:
    AVS2D_PARSE_TRACE("Out.");
    return ret;
}